

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nick.cpp
# Opt level: O0

void __thiscall Enterprise::Nick::Nick(Nick *this,uint8_t *ram)

{
  uint16_t *local_40;
  Rect local_34;
  uint8_t *local_18;
  uint8_t *ram_local;
  Nick *this_local;
  
  local_18 = ram;
  ram_local = (uint8_t *)this;
  Outputs::CRT::CRT::CRT(&this->crt_,0x390,0x10,PAL50,Red4Green4Blue4);
  this->ram_ = local_18;
  this->line_parameter_control_ = 0xc0;
  this->line_parameter_base_ = 0;
  this->border_colour_ = 0;
  this->horizontal_counter_ = 0;
  this->line_parameter_pointer_ = 0;
  this->should_reload_line_parameters_ = true;
  this->last_read_ = 0xff;
  this->lines_remaining_ = '\0';
  this->two_colour_mask_ = 0xff;
  this->left_margin_ = 0;
  this->right_margin_ = 0;
  this->alt_ind_palettes[0] = this->palette_;
  this->alt_ind_palettes[1] = this->palette_;
  this->alt_ind_palettes[2] = this->palette_;
  this->alt_ind_palettes[3] = this->palette_;
  this->mode_ = Vsync;
  this->is_sync_or_pixels_ = false;
  this->bpp_ = 0;
  this->column_size_ = 0;
  this->interrupt_line_ = true;
  this->line_data_per_column_increments_[0] = 0;
  this->line_data_per_column_increments_[1] = 0;
  this->vres_ = false;
  this->reload_line_parameter_pointer_ = false;
  this->pixel_pointer_ = (uint16_t *)0x0;
  this->allocated_pointer_ = (uint16_t *)0x0;
  this->output_duration_ = 0;
  this->output_type_ = Sync;
  local_40 = this->palette_;
  do {
    *local_40 = 0;
    local_40 = local_40 + 1;
  } while (local_40 != (uint16_t *)&this->first_pixel_window_);
  this->first_pixel_window_ = 10;
  set_display_type(this,RGB);
  Outputs::Display::Rect::Rect(&local_34,0.05,0.05,0.9,0.9);
  Outputs::CRT::CRT::set_visible_area(&this->crt_,local_34);
  return;
}

Assistant:

Nick::Nick(const uint8_t *ram) :
	crt_(57*16, 16, Outputs::Display::Type::PAL50, Outputs::Display::InputDataType::Red4Green4Blue4),
	ram_(ram) {

	// Just use RGB for now.
	set_display_type(Outputs::Display::DisplayType::RGB);

	// Crop to the centre 90% of the display.
	crt_.set_visible_area(Outputs::Display::Rect(0.05f, 0.05f, 0.9f, 0.9f));
}